

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TensorUtils.hpp
# Opt level: O0

uint64_t __thiscall scp::TensorShape::getIndex(TensorShape *this,uint64_t *indices)

{
  ulong local_30;
  uint64_t i_1;
  uint64_t result;
  uint64_t i;
  uint64_t *indices_local;
  TensorShape *this_local;
  
  result = 0;
  while( true ) {
    if (this->order <= result) {
      i_1 = *indices;
      for (local_30 = 1; local_30 < this->order; local_30 = local_30 + 1) {
        i_1 = i_1 * this->sizes[local_30] + indices[local_30];
      }
      return i_1;
    }
    if (this->sizes[result] <= indices[result]) break;
    result = result + 1;
  }
  __assert_fail("indices[i] < sizes[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/TensorUtils.hpp"
                ,0x77,"uint64_t scp::TensorShape::getIndex(const uint64_t *) const");
}

Assistant:

constexpr uint64_t TensorShape::getIndex(const uint64_t* indices) const
	{
		for (uint64_t i = 0; i < order; ++i)
		{
			assert(indices[i] < sizes[i]);
		}

		uint64_t result = indices[0];
		for (uint64_t i = 1; i < order; ++i)
		{
			result = result * sizes[i] + indices[i];
		}

		return result;
	}